

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

TermList * __thiscall
Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::insert
          (Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *this,TermSpec *key,
          TermList *val,uint code)

{
  int iVar1;
  Entry *pEVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  ulong uVar4;
  uint uVar5;
  Entry *pEVar6;
  
  pEVar2 = this->_entries;
  uVar4 = (ulong)code % (ulong)(uint)this->_capacity;
  pEVar6 = pEVar2 + uVar4;
  uVar5 = pEVar2[uVar4].code;
  if (uVar5 != 0) {
    do {
      if (((uVar5 == code) &&
          ((pEVar6->_key).__align == (anon_struct_8_0_00000001_for___align)(key->term)._content)) &&
         (*(int *)((long)&pEVar6->_key + 8) == key->index)) goto LAB_002badfa;
      pEVar6 = pEVar6 + 1;
      if (pEVar6 == this->_afterLast) {
        pEVar6 = pEVar2;
      }
      uVar5 = pEVar6->code;
    } while (uVar5 != 0);
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  iVar1 = key->index;
  aVar3 = (anon_struct_8_0_00000001_for___align)val->_content;
  (pEVar6->_key).__align = (anon_struct_8_0_00000001_for___align)(key->term)._content;
  *(int *)((long)&pEVar6->_key + 8) = iVar1;
  (pEVar6->_value).__align = aVar3;
  pEVar6->code = code;
LAB_002badfa:
  return (TermList *)&pEVar6->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }